

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O3

Test * __thiscall
testing::internal::
TestFactoryImpl<bssl::gtest_suite_CertIssuerSourceSyncNormalizationTest_::MultipleMatchesAfterNormalization<bssl::(anonymous_namespace)::CertIssuerSourceStaticTestDelegate>_>
::CreateTest(TestFactoryImpl<bssl::gtest_suite_CertIssuerSourceSyncNormalizationTest_::MultipleMatchesAfterNormalization<bssl::(anonymous_namespace)::CertIssuerSourceStaticTestDelegate>_>
             *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x100);
  Test::Test(this_00);
  this_00->_vptr_Test = (_func_int **)&PTR__CertIssuerSourceSyncTest_006a5358;
  bssl::CertIssuerSourceStatic::CertIssuerSourceStatic((CertIssuerSourceStatic *)(this_00 + 1));
  memset(this_00 + 5,0,0xb0);
  this_00->_vptr_Test = (_func_int **)&PTR__CertIssuerSourceSyncTest_006a5638;
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }